

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  Tables *this_00;
  Symbol symbol;
  EnumDescriptor *parent_00;
  Descriptor *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  string *psVar6;
  EnumValueDescriptorProto *proto_00;
  EnumOptions *orig_options;
  string *name;
  string *local_90;
  Symbol local_80;
  int local_70;
  int i;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *full_name;
  string *scope;
  EnumDescriptor *result_local;
  Descriptor *parent_local;
  EnumDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  scope = (string *)result;
  result_local = (EnumDescriptor *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (EnumDescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    local_90 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_90 = Descriptor::full_name_abi_cxx11_(parent);
  }
  full_name = local_90;
  local_38 = DescriptorPool::Tables::AllocateString(this->tables_,local_90);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::append((ulong)local_38,'\x01');
  }
  psVar6 = local_38;
  EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)psVar6);
  psVar6 = EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar6,local_38,(Message *)parent_local);
  this_00 = this->tables_;
  psVar6 = EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)parent_local);
  psVar6 = DescriptorPool::Tables::AllocateString(this_00,psVar6);
  *(string **)scope = psVar6;
  scope->_M_string_length = (size_type)local_38;
  (scope->field_2)._M_allocated_capacity = (size_type)this->file_;
  *(EnumDescriptor **)((long)&scope->field_2 + 8) = result_local;
  *(undefined1 *)&scope[1]._M_string_length = 0;
  *(undefined1 *)((long)&scope[1]._M_string_length + 1) = 0;
  iVar3 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  if (iVar3 == 0) {
    psVar6 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)scope);
    pDVar1 = parent_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Enums must contain at least one value.",&local_59);
    AddError(this,psVar6,(Message *)pDVar1,NAME,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  iVar3 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  *(int *)((long)&scope[1]._M_string_length + 4) = iVar3;
  iVar3 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
  AllocateArray<google::protobuf::EnumValueDescriptor>
            (this,iVar3,(EnumValueDescriptor **)&scope[1].field_2._M_allocated_capacity);
  local_70 = 0;
  while( true ) {
    iVar3 = local_70;
    iVar4 = EnumDescriptorProto::value_size((EnumDescriptorProto *)parent_local);
    if (iVar4 <= iVar3) break;
    proto_00 = EnumDescriptorProto::value((EnumDescriptorProto *)parent_local,local_70);
    BuildEnumValue(this,proto_00,(EnumDescriptor *)scope,
                   (EnumValueDescriptor *)
                   (scope[1].field_2._M_allocated_capacity + (long)local_70 * 0x28));
    local_70 = local_70 + 1;
  }
  bVar2 = EnumDescriptorProto::has_options((EnumDescriptorProto *)parent_local);
  if (bVar2) {
    orig_options = EnumDescriptorProto::options((EnumDescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::EnumDescriptor>(this,orig_options,(EnumDescriptor *)scope);
  }
  else {
    *(undefined8 *)(scope + 1) = 0;
  }
  psVar6 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)scope);
  parent_00 = result_local;
  name = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)scope);
  pDVar1 = parent_local;
  anon_unknown_1::Symbol::Symbol(&local_80,(EnumDescriptor *)scope);
  symbol.field_1.descriptor = local_80.field_1.descriptor;
  symbol.type = local_80.type;
  symbol._4_4_ = local_80._4_4_;
  AddSymbol(this,psVar6,parent_00,name,(Message *)pDVar1,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}